

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

void __thiscall
tonk::gateway::StateMachine::OnXMLResponse(StateMachine *this,ParsedURL *sourceUrl,ParsedXML *xml)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  size_type sVar4;
  LogStringBuffer *pLVar5;
  long in_RDX;
  long in_RDI;
  int controlIndex;
  ControlEndpoint control;
  value_type *control_1;
  int controlIndex_1;
  int controlCount;
  stringstream full;
  Result result;
  ParsedURL url;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  ParsedURL *in_stack_fffffffffffff5b8;
  LogStringBuffer *in_stack_fffffffffffff5c0;
  value_type *in_stack_fffffffffffff5c8;
  value_type *in_stack_fffffffffffff5d0;
  ParsedURL *in_stack_fffffffffffff5e8;
  ParsedURL *in_stack_fffffffffffff5f0;
  LogStringBuffer *in_stack_fffffffffffff5f8;
  OutputWorker *in_stack_fffffffffffff600;
  int in_stack_fffffffffffff6bc;
  StateMachine *in_stack_fffffffffffff6c0;
  string *in_stack_fffffffffffff768;
  ParsedURL *in_stack_fffffffffffff770;
  int local_858;
  string local_850 [32];
  stringstream local_830 [16];
  ostream local_820 [380];
  int local_6a4;
  string local_6a0 [48];
  long local_670;
  string local_668 [64];
  string local_628 [32];
  ushort local_608;
  long local_5c0;
  long *local_5a8;
  string *local_5a0;
  LogStringBuffer *local_598;
  char *local_590;
  OutputWorker *local_588;
  string *local_580;
  char *local_578;
  undefined8 *local_570;
  string *local_568;
  char *local_560;
  undefined8 *local_558;
  string *local_550;
  char *local_548;
  undefined4 local_53c;
  undefined8 *local_538;
  undefined4 local_52c;
  undefined8 *local_528;
  undefined1 local_510 [16];
  ostream aoStack_500 [376];
  string *local_388;
  char *local_380;
  undefined4 local_374;
  undefined8 *local_370;
  string *local_368;
  char *local_360;
  undefined *local_358;
  undefined1 *local_350;
  undefined8 *local_348;
  undefined *local_340;
  undefined1 *local_338;
  undefined8 *local_330;
  undefined *local_328;
  undefined1 *local_320;
  string *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined8 *local_300;
  string *local_2f8;
  undefined1 *local_2f0;
  undefined8 *local_2e8;
  string *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined8 *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  undefined8 *local_290;
  undefined4 local_284;
  undefined8 *local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  undefined8 *local_c8;
  string *local_c0;
  char *local_b8;
  undefined *local_b0;
  undefined1 *local_a8;
  undefined8 *local_a0;
  undefined *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  undefined *local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  value_type *local_58;
  string *local_50;
  undefined1 *local_48;
  value_type *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  value_type *local_18;
  char *local_10;
  undefined1 *local_8;
  
  local_5c0 = in_RDX;
  ParsedURL::ParsedURL(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ParsedURL::Parse(in_stack_fffffffffffff770,in_stack_fffffffffffff768);
    local_5a8 = &local_670;
    if (local_670 == 0) {
      local_6a4 = 0;
    }
    else {
      Result::ToJson_abi_cxx11_((Result *)in_stack_fffffffffffff5e8);
      local_570 = &ModuleLogger;
      local_578 = "Failed to parse URLBase: ";
      local_580 = local_6a0;
      local_538 = &ModuleLogger;
      local_53c = 4;
      local_548 = "Failed to parse URLBase: ";
      local_528 = &ModuleLogger;
      local_52c = 4;
      local_550 = local_580;
      if (DAT_00329338 < 5) {
        local_370 = &ModuleLogger;
        local_374 = 4;
        local_380 = "Failed to parse URLBase: ";
        local_388 = local_580;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff5c0,(char *)in_stack_fffffffffffff5b8,Trace);
        local_358 = &DAT_00329368;
        local_348 = &ModuleLogger;
        local_350 = local_510;
        local_360 = local_380;
        local_368 = local_388;
        local_330 = &ModuleLogger;
        local_340 = local_358;
        local_338 = local_350;
        local_328 = local_358;
        local_320 = local_350;
        std::operator<<(aoStack_500,(string *)&DAT_00329368);
        local_300 = &ModuleLogger;
        local_308 = local_350;
        local_310 = local_360;
        local_318 = local_368;
        local_2c0 = &ModuleLogger;
        local_2c8 = local_350;
        local_2d0 = local_360;
        local_2b0 = local_350;
        local_2b8 = local_360;
        std::operator<<((ostream *)(local_350 + 0x10),local_360);
        local_2e8 = &ModuleLogger;
        local_2f0 = local_308;
        local_2f8 = local_318;
        local_2d8 = local_308;
        local_2e0 = local_318;
        std::operator<<((ostream *)(local_308 + 0x10),local_318);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x20eeca);
      }
      std::__cxx11::string::~string(local_6a0);
      local_6a4 = 1;
    }
    Result::~Result((Result *)in_stack_fffffffffffff5c0);
    if (local_6a4 != 0) goto LAB_0020f596;
  }
  std::__cxx11::stringstream::stringstream(local_830);
  poVar3 = std::operator<<(local_820,local_628);
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_608);
  std::operator<<(poVar3,(string *)(local_5c0 + 0x40));
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(local_668,local_850);
  std::__cxx11::string::~string(local_850);
  sVar4 = std::
          vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>::
          size((vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                *)(in_RDI + 0x88));
  for (local_858 = 0; local_858 < (int)sVar4; local_858 = local_858 + 1) {
    pLVar5 = (LogStringBuffer *)
             std::
             vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
             ::operator[]((vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                           *)(in_RDI + 0x88),(long)local_858);
    local_5a0 = local_668;
    in_stack_fffffffffffff5f8 = pLVar5;
    local_598 = pLVar5;
    in_stack_fffffffffffff600 = (OutputWorker *)std::__cxx11::string::c_str();
    local_590 = (char *)std::__cxx11::string::c_str();
    local_588 = in_stack_fffffffffffff600;
    iVar1 = strcasecmp((char *)in_stack_fffffffffffff600,local_590);
    if (iVar1 == 0) {
      pLVar5->field_0x120 = true;
      BeginControlSOAPRequests(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
      local_6a4 = 1;
      goto LAB_0020f589;
    }
  }
  local_568 = local_668;
  local_558 = &ModuleLogger;
  local_560 = "Found control endpoint via gateway: ";
  local_290 = &ModuleLogger;
  local_294 = 2;
  local_2a0 = "Found control endpoint via gateway: ";
  local_280 = &ModuleLogger;
  local_284 = 2;
  local_2a8 = local_568;
  if (DAT_00329338 < 3) {
    local_c8 = &ModuleLogger;
    local_cc = 2;
    local_d8 = "Found control endpoint via gateway: ";
    local_e0 = local_568;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_fffffffffffff5c0,(char *)in_stack_fffffffffffff5b8,Trace);
    local_b0 = &DAT_00329368;
    local_a0 = &ModuleLogger;
    local_a8 = local_268;
    local_b8 = local_d8;
    local_c0 = local_e0;
    in_stack_fffffffffffff5c8 = (value_type *)&ModuleLogger;
    local_88 = &ModuleLogger;
    local_98 = local_b0;
    local_90 = local_a8;
    local_80 = local_b0;
    local_78 = local_a8;
    std::operator<<(aoStack_258,(string *)&DAT_00329368);
    local_60 = local_a8;
    local_68 = local_b8;
    local_70 = local_c0;
    local_20 = local_a8;
    local_28 = local_b8;
    local_8 = local_a8;
    local_10 = local_b8;
    in_stack_fffffffffffff5d0 = in_stack_fffffffffffff5c8;
    local_58 = in_stack_fffffffffffff5c8;
    local_18 = in_stack_fffffffffffff5c8;
    std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
    local_48 = local_60;
    local_50 = local_70;
    local_30 = local_60;
    local_38 = local_70;
    local_40 = in_stack_fffffffffffff5c8;
    std::operator<<((ostream *)(local_60 + 0x10),local_70);
    in_stack_fffffffffffff5c0 = (LogStringBuffer *)logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x20f4dd);
  }
  ControlEndpoint::ControlEndpoint((ControlEndpoint *)in_stack_fffffffffffff5c0);
  ParsedURL::operator=((ParsedURL *)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  ParsedXML::operator=
            ((ParsedXML *)in_stack_fffffffffffff5c0,(ParsedXML *)in_stack_fffffffffffff5b8);
  std::vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>::
  push_back((vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
             *)in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  std::vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>::size
            ((vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
              *)(in_RDI + 0x88));
  BeginControlSOAPRequests(in_stack_fffffffffffff6c0,in_stack_fffffffffffff6bc);
  ControlEndpoint::~ControlEndpoint((ControlEndpoint *)in_stack_fffffffffffff5c0);
  local_6a4 = 0;
LAB_0020f589:
  std::__cxx11::stringstream::~stringstream(local_830);
LAB_0020f596:
  ParsedURL::~ParsedURL((ParsedURL *)in_stack_fffffffffffff5c0);
  return;
}

Assistant:

void StateMachine::OnXMLResponse(const ParsedURL& sourceUrl, const ParsedXML& xml)
{
    // Default to using the source host/port
    ParsedURL url = sourceUrl;

    // But if a URLBase is specified, then use that
    if (!xml.URLBase.empty())
    {
        Result result = url.Parse(xml.URLBase);
        if (result.IsFail()) {
            ModuleLogger.Error("Failed to parse URLBase: ", result.ToJson());
            return;
        }
    }

    // Fix up the FullURL before using it to compare URLs
    std::stringstream full;
    full << url.IP << ":" << url.Port << xml.ControlURL;
    url.FullURL = full.str();

    // Find it if it is already in the list
    const int controlCount = (int)ControlEndpoints.size();
    for (int controlIndex = 0; controlIndex < controlCount; ++controlIndex)
    {
        auto& control = ControlEndpoints[controlIndex];

        // If the control URL was found:
        if (control.URL == url)
        {
            // Reactivate endpoint if it is found again on the LAN.
            // This is helpful if we leave and rejoin the same LAN
            control.EndpointActive = true;

            BeginControlSOAPRequests(controlIndex);

            return;
        }
    }

    ModuleLogger.Info("Found control endpoint via gateway: ", url.FullURL);

    ControlEndpoint control;
    control.URL = url;
    control.XML = xml;

    ControlEndpoints.push_back(control);
    const int controlIndex = (int)ControlEndpoints.size() - 1;

    BeginControlSOAPRequests(controlIndex);
}